

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-io.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  uint uVar2;
  environment env;
  vector<float,_std::allocator<float>_> data2;
  vector<float,_std::allocator<float>_> data;
  communicator world;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shape;
  DiscreteBounds full_box;
  NumPy writer;
  file in;
  file out;
  file in2;
  DiscreteBounds sub_box;
  DiscreteBounds box;
  BOV reader;
  NumPy reader2;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = 0x10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&shape,(uint *)&box);
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = 0x10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&shape,(uint *)&box);
  diy::Bounds<int>::Bounds(&box,2);
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 4;
  box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 4;
  box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 7;
  box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 7;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_box,"test.bin",(allocator<char> *)&sub_box);
  diy::mpi::io::file::file(&in,&world,(string *)&full_box,2);
  std::__cxx11::string::~string((string *)&full_box);
  diy::io::BOV::BOV<std::vector<unsigned_int,std::allocator<unsigned_int>>>(&reader,&in,&shape,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Reading");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<float,_std::allocator<float>_>::vector(&data,0x10,(allocator_type *)&full_box);
  uVar2 = 0;
  diy::io::BOV::read<float>
            (&reader,&box,
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start,false,1);
  while( true ) {
    if ((ulong)((long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar2) break;
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = uVar2 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"---");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_box,"test.npy",(allocator<char> *)&sub_box);
  diy::mpi::io::file::file(&in2,&world,(string *)&full_box,2);
  std::__cxx11::string::~string((string *)&full_box);
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader2.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reader2.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader2.super_BOV.offset_ = 0;
  reader2.super_BOV.f_ = &in2;
  diy::io::NumPy::read_header(&reader2);
  std::vector<float,_std::allocator<float>_>::vector(&data2,0x10,(allocator_type *)&full_box);
  uVar2 = 0;
  diy::io::BOV::read<float>
            (&reader2.super_BOV,&box,
             data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
             ._M_start,false,1);
  while( true ) {
    if ((ulong)((long)data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar2) break;
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (&std::cout,
                        data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_box,"out.npy",(allocator<char> *)&sub_box);
  diy::mpi::io::file::file(&out,&world,(string *)&full_box,5);
  std::__cxx11::string::~string((string *)&full_box);
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  writer.super_BOV.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  writer.super_BOV.stride_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.super_BOV.offset_ = 0;
  writer.super_BOV.f_ = &out;
  diy::Bounds<int>::Bounds(&full_box,2);
  diy::Bounds<int>::Bounds(&sub_box,2);
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  full_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 3;
  full_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 3;
  sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 1;
  sub_box.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 1;
  sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 2;
  sub_box.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 2;
  diy::io::NumPy::write_header<float>(&writer,2,&full_box);
  diy::io::BOV::write<float>
            (&writer.super_BOV,&full_box,
             data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
             ._M_start,&sub_box,false,1);
  diy::Bounds<int>::~Bounds(&sub_box);
  diy::Bounds<int>::~Bounds(&full_box);
  diy::io::BOV::~BOV(&writer.super_BOV);
  diy::mpi::io::file::~file(&out);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data2.super__Vector_base<float,_std::allocator<float>_>);
  diy::io::BOV::~BOV(&reader2.super_BOV);
  diy::mpi::io::file::~file(&in2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  diy::io::BOV::~BOV(&reader);
  diy::mpi::io::file::~file(&in);
  diy::Bounds<int>::~Bounds(&box);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  std::vector<unsigned> shape;
  shape.push_back(16);
  shape.push_back(16);

  diy::DiscreteBounds box(2);
  box.min[0] = box.min[1] = 4;
  box.max[0] = box.max[1] = 7;

  diy::mpi::io::file in(world, "test.bin", diy::mpi::io::file::rdonly);
  diy::io::BOV reader(in, shape);

  std::cout << "Reading" << std::endl;
  std::vector<float> data(16);
  reader.read(box, &data[0]);

  for (unsigned i = 0; i < data.size(); ++i)
    std::cout << data[i] << std::endl;

  std::cout << "---" << std::endl;
  diy::mpi::io::file in2(world, "test.npy", diy::mpi::io::file::rdonly);
  diy::io::NumPy  reader2(in2);
  reader2.read_header();
  std::vector<float> data2(16);
  reader2.read(box, &data2[0]);

  for (unsigned i = 0; i < data2.size(); ++i)
    std::cout << data2[i] << std::endl;

  diy::mpi::io::file out(world, "out.npy", diy::mpi::io::file::wronly | diy::mpi::io::file::create);
  diy::io::NumPy     writer(out);
  diy::DiscreteBounds full_box(2), sub_box(2);
  full_box.min[0] = full_box.min[1] = 0;
  full_box.max[0] = full_box.max[1] = 3;
  sub_box.min[0] = sub_box.min[1] = 1;
  sub_box.max[0] = sub_box.max[1] = 2;
  writer.write_header<float>(2, full_box);
  //writer.write(full_box, &data2[0]);
  writer.write(full_box, &data2[0], sub_box);
}